

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weighted_digraph.h
# Opt level: O3

WeightedDigraph<int,_int> * __thiscall
data_structures::WeightedDigraph<int,_int>::addEdge
          (WeightedDigraph<int,_int> *this,int *v,int *w,int weight)

{
  size_t *psVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *pRVar5;
  size_t sVar6;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *pRVar7;
  out_of_range *this_00;
  ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *pLVar8;
  ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *pLVar9;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *pRVar10;
  
  iVar2 = *v;
  iVar3 = *w;
  if (iVar2 == iVar3) {
    return this;
  }
  pRVar10 = (this->super_WeightedGraph<int,_int>)._tree._root;
  for (pRVar5 = pRVar10;
      pRVar5 != (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                 *)0x0; pRVar5 = (&pRVar5->_left)[iVar4 <= iVar2]) {
    iVar4 = (pRVar5->element).key;
    if (iVar4 == iVar2) goto LAB_001031a7;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"Key error, no such key in this tree !");
LAB_0010325e:
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
LAB_001031a7:
  do {
    iVar2 = (pRVar10->element).key;
    if (iVar2 == iVar3) {
      pLVar8 = (pRVar5->element).value._table._list._header;
      sVar6 = (pRVar5->element).value._table._list._size;
      pRVar7 = (pRVar5->element).value._vertex;
      do {
        pLVar8 = pLVar8->_next;
        if (pLVar8 == (ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                       *)0x0) {
          pLVar8 = (pRVar5->element).value._table._list._tail;
          pLVar9 = (ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                    *)operator_new(0x38);
          pLVar9->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010ca18;
          (pLVar9->element)._vptr_SymbolTableElement =
               (_func_int **)&PTR__SymbolTableElement_0010ca48;
          (pLVar9->element).key = pRVar10;
          (pLVar9->element).value.from = pRVar7;
          (pLVar9->element).value.to = pRVar10;
          (pLVar9->element).value.weight = weight;
          pLVar9->_next = pLVar8->_next;
          pLVar8->_next = pLVar9;
          (pRVar5->element).value._table._list._size = sVar6 + 1;
          (pRVar5->element).value._table._list._tail = pLVar9;
          psVar1 = &(this->super_WeightedGraph<int,_int>)._edge_count;
          *psVar1 = *psVar1 + 1;
          return this;
        }
      } while ((pLVar8->element).key != pRVar10);
      (pLVar8->element).value.from = pRVar7;
      (pLVar8->element).value.to = pRVar10;
      (pLVar8->element).value.weight = weight;
      return this;
    }
    pRVar10 = (&pRVar10->_left)[iVar2 <= iVar3];
  } while (pRVar10 !=
           (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
            *)0x0);
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"Key error, no such key in this tree !");
  goto LAB_0010325e;
}

Assistant:

inline
    WeightedDigraph<T, Weight>& WeightedDigraph<T, Weight>::addEdge(const T& v, const T& w, Weight weight){
        if (v == w) {
            return *this;
        }
        auto vp = this->_tree.getNode(v);
        auto wp = this->_tree.getNode(w);
        if (vp->element.value.addEdge(wp, weight)) {
            this->_edge_count++;
        }
        return *this;
    }